

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O3

void __thiscall asl::TabularDataFile::TabularDataFile(TabularDataFile *this,String *filename)

{
  EVP_PKEY_CTX *ctx;
  anon_union_16_2_78e7fdac_for_String_2 *b;
  
  (this->_file).super_File._file = (FILE *)0x0;
  (this->_file).super_File._path._size = 0;
  (this->_file).super_File._path._len = 0;
  (this->_file).super_File._path.field_2._space[0] = '\0';
  (this->_file).super_File._info.size = -1;
  (this->_file).super_File._info.lastModified._t = 0.0;
  (this->_file).super_File._info.creationDate._t = 0.0;
  (this->_file).super_File._info.flags = 0;
  (this->_file).super_File._endian = ENDIAN_NATIVE;
  Array<asl::String>::alloc(&this->_columnNames,0);
  Array<asl::Var>::alloc(&this->_row,0);
  (this->_currentLine).field_2._space[0] = '\0';
  (this->_currentLine)._size = 0;
  (this->_currentLine)._len = 0;
  ctx = (EVP_PKEY_CTX *)0x0;
  Array<asl::String>::alloc(&this->_currentRowParts,0);
  (this->_name).field_2._space[0] = '\0';
  (this->_name)._size = 0;
  (this->_name)._len = 0;
  (this->_types)._size = 0;
  (this->_types)._len = 0;
  (this->_types).field_2._space[0] = '\0';
  (this->_equote)._size = 0;
  (this->_equote)._len = 0;
  (this->_equote).field_2._space[0] = '\0';
  init(this,ctx);
  if (filename->_size == 0) {
    b = &filename->field_2;
  }
  else {
    b = (anon_union_16_2_78e7fdac_for_String_2 *)(filename->field_2)._str;
  }
  String::assign(&this->_name,b->_space,filename->_len);
  return;
}

Assistant:

TabularDataFile::TabularDataFile(const String& filename)
{
	init();
	_name = filename;
}